

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

void __thiscall Matrix::~Matrix(Matrix *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Physical *pPVar2;
  long lVar3;
  pointer pcVar4;
  long lVar5;
  
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0015c778;
  if (this->pSize != (int *)0x0) {
    operator_delete__(this->pSize);
  }
  if (this->pMult != (int *)0x0) {
    operator_delete__(this->pMult);
  }
  pPVar2 = this->pPhysicals;
  if (pPVar2 != (Physical *)0x0) {
    lVar3 = *(long *)&pPVar2[-1].physicalUnit.nExpPrefix;
    if (lVar3 != 0) {
      lVar5 = lVar3 * 0x98;
      do {
        Physical::~Physical((Physical *)((long)pPVar2[-1].physicalUnit.siUnits + lVar5 + -0x34));
        lVar5 = lVar5 + -0x98;
      } while (lVar5 != 0);
    }
    operator_delete__(&pPVar2[-1].physicalUnit.nExpPrefix,lVar3 * 0x98 + 8);
  }
  pcVar4 = (this->sMatrixName)._M_dataplus._M_p;
  paVar1 = &(this->sMatrixName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&(this->matrixParent).pn);
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

Matrix::~Matrix()
{
	delete[] pSize;
	delete[] pMult;
	delete[] pPhysicals;
}